

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O3

void __thiscall
Assimp::ComputeUVMappingProcess::Execute(ComputeUVMappingProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiTextureMapping aVar2;
  uint uVar3;
  undefined8 *****pppppuVar4;
  aiMaterialProperty **ppaVar5;
  undefined8 uVar6;
  undefined8 *****pppppuVar7;
  aiMesh *mesh;
  bool bVar8;
  int iVar9;
  Logger *pLVar10;
  char *pcVar11;
  char *pcVar12;
  aiVector3D *out;
  _List_node_base *p_Var13;
  runtime_error *this_00;
  ulong uVar14;
  aiScene *paVar15;
  aiMaterialProperty *paVar16;
  aiVector3D *this_01;
  ulong uVar17;
  uint m;
  long lVar18;
  aiMaterial *this_02;
  uint idx;
  list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  mappingStack;
  char buffer [1024];
  int local_4a4;
  aiMaterialProperty *local_4a0;
  aiMaterial *local_498;
  aiTextureMapping local_48c;
  aiVector3D aStack_488;
  int iStack_47c;
  ulong local_478;
  aiTextureMapping *local_470;
  undefined8 ****local_468;
  undefined8 ****local_460;
  undefined8 **local_458 [2];
  aiScene *local_448;
  ulong local_440;
  char local_438 [1032];
  
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"GenUVCoordsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_468 = (undefined8 ****)local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_468,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)&local_468);
    *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_468 = &local_468;
  local_458[0] = (undefined8 ***)0x0;
  local_460 = local_468;
  if (pScene->mNumMaterials != 0) {
    uVar17 = 0;
    local_448 = pScene;
    do {
      pppppuVar7 = (undefined8 *****)local_468;
      paVar15 = local_448;
      while (local_448 = paVar15, pppppuVar7 != &local_468) {
        pppppuVar4 = (undefined8 *****)*pppppuVar7;
        operator_delete(pppppuVar7,0x28);
        pppppuVar7 = pppppuVar4;
        paVar15 = local_448;
      }
      local_458[0] = (undefined8 ***)0x0;
      this_02 = paVar15->mMaterials[uVar17];
      local_468 = &local_468;
      local_460 = &local_468;
      if (this_02->mNumProperties != 0) {
        uVar14 = 0;
        local_498 = this_02;
        local_478 = uVar17;
        do {
          paVar16 = this_02->mProperties[uVar14];
          local_440 = uVar14;
          iVar9 = strcmp((paVar16->mKey).data,"$tex.mapping");
          if ((iVar9 == 0) &&
             (local_470 = (aiTextureMapping *)paVar16->mData, *local_470 != aiTextureMapping_UV)) {
            local_4a0 = paVar16;
            bVar8 = DefaultLogger::isNullLogger();
            if (!bVar8) {
              pcVar11 = TextureTypeToString(local_4a0->mSemantic);
              uVar1 = local_4a0->mIndex;
              pcVar12 = MappingTypeToString(*local_470);
              snprintf(local_438,0x400,"Found non-UV mapped texture (%s,%u). Mapping type: %s",
                       pcVar11,(ulong)uVar1,pcVar12);
              pLVar10 = DefaultLogger::get();
              Logger::info(pLVar10,local_438);
            }
            aVar2 = *local_470;
            uVar17 = local_478;
            this_02 = local_498;
            if (aVar2 != aiTextureMapping_OTHER) {
              aStack_488.x = 0.0;
              aStack_488.y = 1.0;
              aStack_488.z = 0.0;
              iStack_47c = 0;
              uVar1 = local_498->mNumProperties;
              local_48c = aVar2;
              if ((ulong)uVar1 != 0) {
                ppaVar5 = local_498->mProperties;
                uVar3 = local_4a0->mSemantic;
                uVar17 = 0;
                do {
                  paVar16 = ppaVar5[uVar17];
                  if (((paVar16->mSemantic == uVar3) && (paVar16->mIndex == local_4a0->mIndex)) &&
                     (iVar9 = strcmp((paVar16->mKey).data,"$tex.mapaxis"), iVar9 == 0)) {
                    aStack_488.z = *(float *)(paVar16->mData + 8);
                    uVar6 = *(undefined8 *)paVar16->mData;
                    aStack_488.x = (float)uVar6;
                    aStack_488.y = (float)((ulong)uVar6 >> 0x20);
                    break;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar1 != uVar17);
              }
              paVar15 = local_448;
              local_4a4 = 99999999;
              for (pppppuVar7 = (undefined8 *****)local_468; pppppuVar7 != &local_468;
                  pppppuVar7 = (undefined8 *****)*pppppuVar7) {
                if (*(aiTextureMapping *)(pppppuVar7 + 2) == aVar2) {
                  if ((*(float *)((long)pppppuVar7 + 0x14) == aStack_488.x) &&
                     (!NAN(*(float *)((long)pppppuVar7 + 0x14)) && !NAN(aStack_488.x))) {
                    if ((*(float *)(pppppuVar7 + 3) == aStack_488.y) &&
                       (!NAN(*(float *)(pppppuVar7 + 3)) && !NAN(aStack_488.y))) {
                      if ((*(float *)((long)pppppuVar7 + 0x1c) == aStack_488.z) &&
                         (!NAN(*(float *)((long)pppppuVar7 + 0x1c)) && !NAN(aStack_488.z))) break;
                    }
                  }
                }
              }
              uVar17 = local_478;
              if (&local_468 == pppppuVar7) {
                if (local_448->mNumMeshes != 0) {
                  uVar14 = 0;
                  do {
                    mesh = paVar15->mMeshes[uVar14];
                    iVar9 = local_4a4;
                    if (uVar17 == mesh->mMaterialIndex) {
                      lVar18 = 0;
                      do {
                        if (mesh->mTextureCoords[lVar18] == (aiVector3D *)0x0) {
                          if ((ulong)mesh->mNumVertices != 0) {
                            uVar17 = (ulong)mesh->mNumVertices * 0xc;
                            out = (aiVector3D *)operator_new__(uVar17);
                            this_01 = out;
                            memset(out,0,((uVar17 - 0xc) / 0xc) * 0xc + 0xc);
                            mesh->mTextureCoords[lVar18] = out;
                            switch(*local_470) {
                            case aiTextureMapping_SPHERE:
                              ComputeSphereMapping
                                        ((ComputeUVMappingProcess *)this_01,mesh,&aStack_488,out);
                              break;
                            case aiTextureMapping_CYLINDER:
                              ComputeCylinderMapping
                                        ((ComputeUVMappingProcess *)this_01,mesh,&aStack_488,out);
                              break;
                            case aiTextureMapping_BOX:
                              pLVar10 = DefaultLogger::get();
                              Logger::error(pLVar10,"Mapping type currently not implemented");
                              break;
                            case aiTextureMapping_PLANE:
                              ComputePlaneMapping((ComputeUVMappingProcess *)this_01,mesh,
                                                  &aStack_488,out);
                              break;
                            default:
                              __assert_fail("false",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ComputeUVMappingProcess.cpp"
                                            ,0x1e4,
                                            "virtual void Assimp::ComputeUVMappingProcess::Execute(aiScene *)"
                                           );
                            }
                            iVar9 = (int)lVar18;
                            uVar17 = local_478;
                            if ((uVar14 != 0) && (local_4a4 != iVar9)) {
                              pLVar10 = DefaultLogger::get();
                              Logger::warn(pLVar10,
                                           "UV index mismatch. Not all meshes assigned to this material have equal numbers of UV channels. The UV index stored in  the material structure does therefore not apply for all meshes. "
                                          );
                              uVar17 = local_478;
                            }
                          }
                          goto LAB_003c7ea0;
                        }
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 8);
                      pLVar10 = DefaultLogger::get();
                      Logger::error(pLVar10,
                                    "Unable to compute UV coordinates, no free UV slot found");
                      iVar9 = local_4a4;
                    }
LAB_003c7ea0:
                    local_4a4 = iVar9;
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < paVar15->mNumMeshes);
                }
                this_02 = local_498;
                iStack_47c = local_4a4;
                p_Var13 = (_List_node_base *)operator_new(0x28);
                paVar16 = local_4a0;
                *(int *)&p_Var13[2]._M_next = iStack_47c;
                p_Var13[1]._M_next = (_List_node_base *)CONCAT44(aStack_488.x,local_48c);
                p_Var13[1]._M_prev = (_List_node_base *)CONCAT44(aStack_488.z,aStack_488.y);
                std::__detail::_List_node_base::_M_hook(p_Var13);
                local_458[0] = (undefined8 **)((long)local_458[0] + 1);
              }
              else {
                local_4a4 = *(int *)(pppppuVar7 + 4);
                paVar16 = local_4a0;
                this_02 = local_498;
              }
              *local_470 = aiTextureMapping_UV;
              aiMaterial::AddBinaryProperty
                        (this_02,&local_4a4,4,"$tex.uvwsrc",paVar16->mSemantic,paVar16->mIndex,
                         aiPTI_Buffer);
            }
          }
          uVar14 = local_440 + 1;
        } while (uVar14 < this_02->mNumProperties);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < paVar15->mNumMaterials);
  }
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"GenUVCoordsProcess finished");
  pppppuVar7 = (undefined8 *****)local_468;
  while (pppppuVar7 != &local_468) {
    pppppuVar4 = (undefined8 *****)*pppppuVar7;
    operator_delete(pppppuVar7,0x28);
    pppppuVar7 = pppppuVar4;
  }
  return;
}

Assistant:

void ComputeUVMappingProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess begin");
    char buffer[1024];

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT)
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");

    std::list<MappingInfo> mappingStack;

    /*  Iterate through all materials and search for non-UV mapped textures
     */
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        mappingStack.clear();
        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)
        {
            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.mapping"))
            {
                aiTextureMapping& mapping = *((aiTextureMapping*)prop->mData);
                if (aiTextureMapping_UV != mapping)
                {
                    if (!DefaultLogger::isNullLogger())
                    {
                        ai_snprintf(buffer, 1024, "Found non-UV mapped texture (%s,%u). Mapping type: %s",
                            TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex,
                            MappingTypeToString(mapping));

                        ASSIMP_LOG_INFO(buffer);
                    }

                    if (aiTextureMapping_OTHER == mapping)
                        continue;

                    MappingInfo info (mapping);

                    // Get further properties - currently only the major axis
                    for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)
                    {
                        aiMaterialProperty* prop2 = mat->mProperties[a2];
                        if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex)
                            continue;

                        if ( !::strcmp( prop2->mKey.data, "$tex.mapaxis"))  {
                            info.axis = *((aiVector3D*)prop2->mData);
                            break;
                        }
                    }

                    unsigned int idx( 99999999 );

                    // Check whether we have this mapping mode already
                    std::list<MappingInfo>::iterator it = std::find (mappingStack.begin(),mappingStack.end(), info);
                    if (mappingStack.end() != it)
                    {
                        idx = (*it).uv;
                    }
                    else
                    {
                        /*  We have found a non-UV mapped texture. Now
                        *   we need to find all meshes using this material
                        *   that we can compute UV channels for them.
                        */
                        for (unsigned int m = 0; m < pScene->mNumMeshes;++m)
                        {
                            aiMesh* mesh = pScene->mMeshes[m];
                            unsigned int outIdx = 0;
                            if ( mesh->mMaterialIndex != i || ( outIdx = FindEmptyUVChannel(mesh) ) == UINT_MAX ||
                                !mesh->mNumVertices)
                            {
                                continue;
                            }

                            // Allocate output storage
                            aiVector3D* p = mesh->mTextureCoords[outIdx] = new aiVector3D[mesh->mNumVertices];

                            switch (mapping)
                            {
                            case aiTextureMapping_SPHERE:
                                ComputeSphereMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_CYLINDER:
                                ComputeCylinderMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_PLANE:
                                ComputePlaneMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_BOX:
                                ComputeBoxMapping(mesh,p);
                                break;
                            default:
                                ai_assert(false);
                            }
                            if (m && idx != outIdx)
                            {
                                ASSIMP_LOG_WARN("UV index mismatch. Not all meshes assigned to "
                                    "this material have equal numbers of UV channels. The UV index stored in  "
                                    "the material structure does therefore not apply for all meshes. ");
                            }
                            idx = outIdx;
                        }
                        info.uv = idx;
                        mappingStack.push_back(info);
                    }

                    // Update the material property list
                    mapping = aiTextureMapping_UV;
                    ((aiMaterial*)mat)->AddProperty(&idx,1,AI_MATKEY_UVWSRC(prop->mSemantic,prop->mIndex));
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess finished");
}